

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_operationset.c
# Opt level: O2

void FAudio_OPERATIONSET_Commit(FAudio *audio,uint32_t OperationSet)

{
  FAudio_OPERATIONSET_Operation *pFVar1;
  FAudio_OPERATIONSET_Operation *pFVar2;
  FAudio_OPERATIONSET_Operation **ppFVar3;
  FAudio_OPERATIONSET_Operation *pFVar4;
  FAudio_OPERATIONSET_Operation *pFVar5;
  FAudio_OPERATIONSET_Operation **ppFVar6;
  
  FAudio_PlatformLockMutex(audio->operationLock);
  if (audio->queuedOperations != (FAudio_OPERATIONSET_Operation *)0x0) {
    ppFVar6 = &audio->committedOperations;
    do {
      ppFVar3 = ppFVar6;
      ppFVar6 = &(*ppFVar3)->next;
    } while (*ppFVar3 != (FAudio_OPERATIONSET_Operation *)0x0);
    pFVar2 = audio->queuedOperations;
    pFVar4 = (FAudio_OPERATIONSET_Operation *)0x0;
    do {
      pFVar1 = pFVar2->next;
      pFVar5 = pFVar2;
      if (pFVar2->OperationSet == OperationSet) {
        ppFVar6 = &pFVar4->next;
        if (pFVar4 == (FAudio_OPERATIONSET_Operation *)0x0) {
          ppFVar6 = &audio->queuedOperations;
        }
        *ppFVar6 = pFVar1;
        *ppFVar3 = pFVar2;
        ppFVar3 = &pFVar2->next;
        pFVar2->next = (FAudio_OPERATIONSET_Operation *)0x0;
        pFVar5 = pFVar4;
      }
      pFVar2 = pFVar1;
      pFVar4 = pFVar5;
    } while (pFVar1 != (FAudio_OPERATIONSET_Operation *)0x0);
  }
  FAudio_PlatformUnlockMutex(audio->operationLock);
  return;
}

Assistant:

void FAudio_OPERATIONSET_Commit(FAudio *audio, uint32_t OperationSet)
{
	FAudio_OPERATIONSET_Operation *op, *next, *prev, **committed_end;

	FAudio_PlatformLockMutex(audio->operationLock);
	LOG_MUTEX_LOCK(audio, audio->operationLock)

	if (audio->queuedOperations == NULL)
	{
		FAudio_PlatformUnlockMutex(audio->operationLock);
		LOG_MUTEX_UNLOCK(audio, audio->operationLock)
		return;
	}

	committed_end = &audio->committedOperations;
	while (*committed_end)
	{
		committed_end = &((*committed_end)->next);
	}

	op = audio->queuedOperations;
	prev = NULL;
	do
	{
		next = op->next;
		if (op->OperationSet == OperationSet)
		{
			if (prev == NULL) /* Start of linked list */
			{
				audio->queuedOperations = next;
			}
			else
			{
				prev->next = next;
			}

			*committed_end = op;
			op->next = NULL;
			committed_end = &op->next;
		}
		else
		{
			prev = op;
		}
		op = next;
	} while (op != NULL);

	FAudio_PlatformUnlockMutex(audio->operationLock);
	LOG_MUTEX_UNLOCK(audio, audio->operationLock)
}